

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# coding.cc
# Opt level: O0

char * leveldb::EncodeVarint64(char *dst,uint64_t v)

{
  byte *local_20;
  uchar *ptr;
  uint64_t v_local;
  char *dst_local;
  
  local_20 = (byte *)dst;
  for (ptr = (uchar *)v; (uchar *)0x7f < ptr; ptr = (uchar *)((ulong)ptr >> 7)) {
    *local_20 = (byte)ptr & 0x7f | 0x80;
    local_20 = local_20 + 1;
  }
  *local_20 = (byte)ptr;
  return (char *)(local_20 + 1);
}

Assistant:

char *EncodeVarint64(char *dst, uint64_t v) {
        static const int B = 128;
        unsigned char *ptr = reinterpret_cast<unsigned char *>(dst);
        while (v >= B) {
            *(ptr++) = (v & (B - 1)) | B;
            v >>= 7;
        }
        *(ptr++) = static_cast<unsigned char>(v);
        return reinterpret_cast<char *>(ptr);
    }